

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadBlif.c
# Opt level: O3

int Prs_CreateBlifNtk(Cba_Ntk_t *p,Prs_Ntk_t *pNtk)

{
  long lVar1;
  int iVar2;
  Cba_Man_t *pCVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  int *piVar8;
  int Fill;
  int Fill_00;
  int Fill_01;
  int Fill_02;
  int Fill_03;
  int Fill_04;
  int Fill_05;
  int Fill_06;
  int Fill_07;
  int Fill_08;
  int Fill_09;
  int Fill_10;
  int *in_RDX;
  int *extraout_RDX;
  int *extraout_RDX_00;
  int *extraout_RDX_01;
  int *extraout_RDX_02;
  int *extraout_RDX_03;
  int *extraout_RDX_04;
  int *extraout_RDX_05;
  int *extraout_RDX_06;
  int *extraout_RDX_07;
  int *extraout_RDX_08;
  int *extraout_RDX_09;
  int *extraout_RDX_10;
  long lVar9;
  void *pvVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  
  pCVar3 = p->pDesign;
  if (0 < (pCVar3->vUsed).nSize) {
    piVar8 = (pCVar3->vUsed).pArray;
    in_RDX = (int *)0x0;
    do {
      iVar11 = piVar8[(long)in_RDX];
      if (((long)iVar11 < 0) || ((pCVar3->vNameMap).nSize <= iVar11)) goto LAB_003df173;
      (pCVar3->vNameMap).pArray[iVar11] = 0;
      in_RDX = (int *)((long)in_RDX + 1);
    } while ((long)in_RDX < (long)(pCVar3->vUsed).nSize);
  }
  (pCVar3->vUsed).nSize = 0;
  if (0 < (p->vInputs).nSize) {
    lVar9 = 0;
    do {
      iVar11 = (p->vInputs).pArray[lVar9];
      lVar15 = (long)iVar11;
      if (lVar15 < 1) goto LAB_003df19b;
      if ((p->vObjName).nSize < 1) goto LAB_003df192;
      Vec_IntFillExtra(&p->vObjName,iVar11 + 1,(int)in_RDX);
      if (((p->vObjName).nSize <= iVar11) || ((p->vObjFon0).nSize <= iVar11)) goto LAB_003df154;
      uVar5 = (p->vObjName).pArray[lVar15];
      pCVar3 = p->pDesign;
      iVar11 = (p->vObjFon0).pArray[lVar15];
      Vec_IntFillExtra(&pCVar3->vNameMap,uVar5 + 1,Fill);
      if (((int)uVar5 < 0) || ((pCVar3->vNameMap).nSize <= (int)uVar5)) goto LAB_003df154;
      if ((pCVar3->vNameMap).pArray[uVar5] != 0) goto LAB_003df1d9;
      Vec_IntFillExtra(&pCVar3->vNameMap,uVar5 + 1,Fill_00);
      if ((pCVar3->vNameMap).nSize <= (int)uVar5) goto LAB_003df173;
      (pCVar3->vNameMap).pArray[uVar5] = iVar11;
      Vec_IntPush(&pCVar3->vUsed,uVar5);
      lVar9 = lVar9 + 1;
      in_RDX = extraout_RDX;
    } while (lVar9 < (p->vInputs).nSize);
  }
  if (0 < (pNtk->vObjs).nSize) {
    lVar9 = 0;
    do {
      piVar8 = (pNtk->vObjs).pArray;
      iVar11 = piVar8[lVar9];
      if (((long)iVar11 < 0) || (uVar5 = (pNtk->vBoxes).nSize, (int)uVar5 <= iVar11))
      goto LAB_003df154;
      piVar4 = (pNtk->vBoxes).pArray;
      Prs_BoxSignals_V_1 = piVar4[iVar11] - 2;
      iVar6 = piVar8[lVar9];
      if (((long)iVar6 < -3) || (uVar5 <= iVar6 + 3U)) goto LAB_003df255;
      Prs_BoxSignals_V_2 = piVar4 + (iVar6 + 3U);
      if (((((pNtk->vObjs).nSize <= lVar9) || (iVar6 < -1)) || (uVar5 <= iVar6 + 1U)) || (iVar6 < 0)
         ) goto LAB_003df154;
      iVar2 = piVar4[iVar6];
      if (iVar2 < 4) {
        __assert_fail("Prs_BoxIONum(pNtk, i) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadBlif.c"
                      ,0x1f6,"int Prs_CreateBlifNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
      }
      if ((piVar4[iVar11] & 1U) != 0) {
        __assert_fail("Vec_IntSize(vBox) % 2 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadBlif.c"
                      ,0x1f7,"int Prs_CreateBlifNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
      }
      iVar11 = piVar4[iVar6 + 1U];
      if (iVar11 == -1) {
        uVar5 = Cba_ObjAlloc(p,CBA_BOX_DFFRS,4,1);
        if (Prs_BoxSignals_V_1 < 4) goto LAB_003df154;
        if ((int)uVar5 < 1) {
LAB_003df2d1:
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
        }
        if ((p->vObjFon0).nSize <= (int)uVar5) goto LAB_003df154;
        uVar14 = Prs_BoxSignals_V_2[3];
        pCVar3 = p->pDesign;
        iVar11 = (p->vObjFon0).pArray[uVar5];
        Vec_IntFillExtra(&pCVar3->vNameMap,uVar14 + 1,Fill_01);
        if (((int)uVar14 < 0) || ((pCVar3->vNameMap).nSize <= (int)uVar14)) goto LAB_003df154;
        if ((pCVar3->vNameMap).pArray[uVar14] != 0) {
LAB_003df1d9:
          __assert_fail("Vec_IntGetEntry(&p->vNameMap, i) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0x30e,"void Cba_ManSetMap(Cba_Man_t *, int, int)");
        }
        Vec_IntFillExtra(&pCVar3->vNameMap,uVar14 + 1,Fill_02);
        if ((pCVar3->vNameMap).nSize <= (int)uVar14) {
LAB_003df173:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (pCVar3->vNameMap).pArray[uVar14] = iVar11;
        Vec_IntPush(&pCVar3->vUsed,uVar14);
        if ((((pNtk->vObjs).nSize <= lVar9) || (iVar11 = (pNtk->vObjs).pArray[lVar9], iVar11 < -2))
           || (uVar14 = iVar11 + 2, (pNtk->vBoxes).nSize <= (int)uVar14)) goto LAB_003df154;
        iVar11 = (pNtk->vBoxes).pArray[uVar14] + 1;
LAB_003deb6c:
        Cba_ObjSetFunc(p,uVar5,iVar11);
        in_RDX = extraout_RDX_04;
      }
      else {
        if (*Prs_BoxSignals_V_2 == 0) {
          uVar5 = Cba_ObjAlloc(p,CBA_BOX_NODE,((iVar2 - (iVar2 + -2 >> 0x1f)) + -2 >> 1) + -1,1);
          if ((int)uVar5 < 1) goto LAB_003df2d1;
          if ((int)uVar5 < (p->vObjFon0).nSize) {
            if ((long)Prs_BoxSignals_V_1 < 1) {
LAB_003df2f0:
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
            }
            Cba_FonSetName(p,(p->vObjFon0).pArray[uVar5],
                           Prs_BoxSignals_V_2[(long)Prs_BoxSignals_V_1 + -1]);
            if ((long)Prs_BoxSignals_V_1 < 1) goto LAB_003df2f0;
            if ((int)uVar5 < (p->vObjFon0).nSize) {
              uVar14 = Prs_BoxSignals_V_2[(long)Prs_BoxSignals_V_1 + -1];
              pCVar3 = p->pDesign;
              iVar6 = (p->vObjFon0).pArray[uVar5];
              Vec_IntFillExtra(&pCVar3->vNameMap,uVar14 + 1,Fill_07);
              if ((-1 < (int)uVar14) && ((int)uVar14 < (pCVar3->vNameMap).nSize)) {
                if ((pCVar3->vNameMap).pArray[uVar14] == 0) {
                  Vec_IntFillExtra(&pCVar3->vNameMap,uVar14 + 1,Fill_08);
                  if ((int)uVar14 < (pCVar3->vNameMap).nSize) {
                    (pCVar3->vNameMap).pArray[uVar14] = iVar6;
                    Vec_IntPush(&pCVar3->vUsed,uVar14);
                    goto LAB_003deb6c;
                  }
                  goto LAB_003df173;
                }
                goto LAB_003df1d9;
              }
            }
          }
          goto LAB_003df154;
        }
        pCVar3 = p->pDesign;
        pcVar7 = Abc_NamStr(pNtk->pStrs,iVar11);
        uVar5 = Abc_NamStrFind(pCVar3->pMods,pcVar7);
        if (((int)uVar5 < 1) || ((pCVar3->vNtks).nSize <= (int)uVar5)) {
          pvVar10 = (void *)0x0;
        }
        else {
          pvVar10 = (pCVar3->vNtks).pArray[uVar5];
        }
        uVar5 = Cba_ObjAlloc(p,CBA_OBJ_BOX,*(int *)((long)pvVar10 + 0x1c),
                             *(int *)((long)pvVar10 + 0x2c));
        Cba_ObjSetFunc(p,uVar5,*(int *)((long)pvVar10 + 8));
        pCVar3 = p->pDesign;
        in_RDX = extraout_RDX_00;
        if (0 < (pCVar3->vUsed2).nSize) {
          piVar8 = (pCVar3->vUsed2).pArray;
          in_RDX = (int *)0x0;
          do {
            iVar11 = piVar8[(long)in_RDX];
            if (((long)iVar11 < 0) || ((pCVar3->vNameMap2).nSize <= iVar11)) goto LAB_003df173;
            (pCVar3->vNameMap2).pArray[iVar11] = 0;
            in_RDX = (int *)((long)in_RDX + 1);
          } while ((long)in_RDX < (long)(pCVar3->vUsed2).nSize);
        }
        (pCVar3->vUsed2).nSize = 0;
        if (0 < *(int *)((long)pvVar10 + 0x2c)) {
          lVar15 = 0;
          do {
            iVar11 = *(int *)(*(long *)((long)pvVar10 + 0x30) + lVar15 * 4);
            if ((long)iVar11 < 1) goto LAB_003df19b;
            if (*(int *)((long)pvVar10 + 0xcc) < 1) goto LAB_003df192;
            Vec_IntFillExtra((Vec_Int_t *)((long)pvVar10 + 200),iVar11 + 1,(int)in_RDX);
            if (*(int *)((long)pvVar10 + 0xcc) <= iVar11) goto LAB_003df154;
            iVar11 = *(int *)(*(long *)((long)pvVar10 + 0xd0) + (long)iVar11 * 4);
            lVar12 = (long)iVar11;
            pCVar3 = p->pDesign;
            Vec_IntFillExtra(&pCVar3->vNameMap2,iVar11 + 1,Fill_03);
            if ((lVar12 < 0) || ((pCVar3->vNameMap2).nSize <= iVar11)) goto LAB_003df154;
            if ((pCVar3->vNameMap2).pArray[lVar12] != 0) goto LAB_003df1ba;
            Vec_IntFillExtra(&pCVar3->vNameMap2,iVar11 + 1,Fill_04);
            if ((pCVar3->vNameMap2).nSize <= iVar11) goto LAB_003df173;
            lVar1 = lVar15 + 1;
            (pCVar3->vNameMap2).pArray[lVar12] = (int)lVar15 + 1;
            Vec_IntPush(&pCVar3->vUsed2,iVar11);
            in_RDX = extraout_RDX_01;
            lVar15 = lVar1;
          } while (lVar1 < *(int *)((long)pvVar10 + 0x2c));
        }
        if (1 < Prs_BoxSignals_V_1) {
          lVar15 = 1;
          do {
            iVar11 = Prs_BoxSignals_V_2[lVar15 + -1];
            lVar12 = (long)iVar11;
            uVar14 = Prs_BoxSignals_V_2[lVar15];
            pCVar3 = p->pDesign;
            Vec_IntFillExtra(&pCVar3->vNameMap2,iVar11 + 1,(int)in_RDX);
            if ((lVar12 < 0) || ((pCVar3->vNameMap2).nSize <= iVar11)) goto LAB_003df154;
            in_RDX = extraout_RDX_02;
            if ((pCVar3->vNameMap2).pArray[lVar12] != 0) {
              pCVar3 = p->pDesign;
              Vec_IntFillExtra(&pCVar3->vNameMap2,iVar11 + 1,(int)extraout_RDX_02);
              if ((pCVar3->vNameMap2).nSize <= iVar11) goto LAB_003df154;
              if ((int)uVar5 < 1) {
                __assert_fail("i>0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                              ,0xea,"int Cba_ObjFon(Cba_Ntk_t *, int, int)");
              }
              if ((p->vObjFon0).nSize <= (int)uVar5) goto LAB_003df154;
              iVar11 = (pCVar3->vNameMap2).pArray[lVar12] + -1 + (p->vObjFon0).pArray[uVar5];
              Cba_FonSetName(p,iVar11,uVar14);
              pCVar3 = p->pDesign;
              Vec_IntFillExtra(&pCVar3->vNameMap,uVar14 + 1,Fill_05);
              if (((int)uVar14 < 0) || ((pCVar3->vNameMap).nSize <= (int)uVar14)) goto LAB_003df154;
              if ((pCVar3->vNameMap).pArray[uVar14] != 0) goto LAB_003df1d9;
              Vec_IntFillExtra(&pCVar3->vNameMap,uVar14 + 1,Fill_06);
              if ((pCVar3->vNameMap).nSize <= (int)uVar14) goto LAB_003df173;
              (pCVar3->vNameMap).pArray[uVar14] = iVar11;
              Vec_IntPush(&pCVar3->vUsed,uVar14);
              in_RDX = extraout_RDX_03;
            }
            lVar15 = lVar15 + 2;
          } while ((int)lVar15 < Prs_BoxSignals_V_1);
        }
      }
      lVar9 = lVar9 + 1;
      iVar11 = (pNtk->vObjs).nSize;
    } while (lVar9 < iVar11);
    if (0 < iVar11) {
      lVar9 = 0;
      do {
        piVar8 = (pNtk->vObjs).pArray;
        iVar11 = piVar8[lVar9];
        if (((long)iVar11 < 0) || (uVar5 = (pNtk->vBoxes).nSize, (int)uVar5 <= iVar11))
        goto LAB_003df154;
        in_RDX = (pNtk->vBoxes).pArray;
        iVar11 = in_RDX[iVar11];
        Prs_BoxSignals_V_1 = iVar11 + -2;
        iVar6 = piVar8[lVar9];
        if ((iVar6 < -3) || (uVar5 <= iVar6 + 3U)) {
LAB_003df255:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        Prs_BoxSignals_V_2 = in_RDX + (iVar6 + 3U);
        if ((((pNtk->vObjs).nSize <= lVar9) || (iVar6 < -1)) || (uVar5 <= iVar6 + 1U))
        goto LAB_003df154;
        iVar2 = (p->vOutputs).nSize;
        iVar13 = (p->vInputs).nSize + (int)lVar9;
        uVar5 = iVar2 + iVar13 + 1;
        iVar13 = iVar13 + iVar2;
        if (in_RDX[iVar6 + 1U] == -1) {
          if (iVar13 < 0) {
LAB_003df30f:
            __assert_fail("i>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                          ,0xd5,"Cba_ObjType_t Cba_ObjType(Cba_Ntk_t *, int)");
          }
          if ((p->vObjType).nSize <= (int)uVar5) goto LAB_003df2b2;
          if ((p->vObjType).pArray[uVar5] != 'W') {
            __assert_fail("Cba_ObjType(p, iObj) == CBA_BOX_DFFRS",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadBlif.c"
                          ,0x21e,"int Prs_CreateBlifNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          if (iVar11 < 4) goto LAB_003df154;
          iVar11 = Prs_CreateBlifFindFon(p,Prs_BoxSignals_V_2[1]);
          in_RDX = extraout_RDX_05;
          if (iVar11 != 0) {
            if ((p->vObjFin0).nSize <= (int)uVar5) goto LAB_003df154;
            iVar6 = (p->vObjFin0).pArray[uVar5];
            lVar15 = (long)iVar6;
            if (lVar15 < 1) goto LAB_003df217;
            if ((p->vFinFon).nSize <= iVar6) goto LAB_003df154;
            in_RDX = (p->vFinFon).pArray;
            if (in_RDX[lVar15] != 0) goto LAB_003df236;
            in_RDX[lVar15] = iVar11;
          }
        }
        else if (*Prs_BoxSignals_V_2 == 0) {
          if (iVar13 < 0) goto LAB_003df30f;
          if ((p->vObjType).nSize <= (int)uVar5) goto LAB_003df2b2;
          if ((p->vObjType).pArray[uVar5] != 'G') {
            __assert_fail("Cba_ObjType(p, iObj) == CBA_BOX_NODE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadBlif.c"
                          ,0x225,"int Prs_CreateBlifNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          if (3 < iVar11) {
            lVar15 = 1;
            iVar11 = 0;
            do {
              if ((p->vObjFin0).nSize <= (int)(iVar13 + 2U)) goto LAB_003df154;
              piVar8 = (p->vObjFin0).pArray;
              in_RDX = (int *)(ulong)(uint)((piVar8[iVar13 + 2U] - piVar8[uVar5]) * 2);
              if ((int *)(lVar15 - 1U) == in_RDX) break;
              iVar6 = Prs_CreateBlifFindFon(p,Prs_BoxSignals_V_2[lVar15]);
              in_RDX = extraout_RDX_09;
              if (iVar6 != 0) {
                if ((p->vObjFin0).nSize <= (int)uVar5) goto LAB_003df154;
                uVar14 = (p->vObjFin0).pArray[uVar5] + iVar11;
                if ((int)uVar14 < 1) goto LAB_003df217;
                if ((p->vFinFon).nSize <= (int)uVar14) goto LAB_003df154;
                in_RDX = (p->vFinFon).pArray;
                if (in_RDX[uVar14] != 0) goto LAB_003df236;
                in_RDX[uVar14] = iVar6;
              }
              lVar15 = lVar15 + 2;
              iVar11 = iVar11 + 1;
            } while ((int)lVar15 < Prs_BoxSignals_V_1);
          }
        }
        else {
          if (iVar13 < 0) {
            __assert_fail("i>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                          ,0x106,"Cba_Ntk_t *Cba_ObjNtk(Cba_Ntk_t *, int)");
          }
          if ((p->vObjType).nSize <= (int)uVar5) {
LAB_003df2b2:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          piVar8 = (int *)(ulong)uVar5;
          if (((p->vObjType).pArray[(long)piVar8] == '\x03') && (0 < (p->vObjFunc).nSize)) {
            Vec_IntFillExtra(&p->vObjFunc,iVar13 + 2,(int)in_RDX);
            if ((p->vObjFunc).nSize <= (int)uVar5) goto LAB_003df154;
            iVar11 = (p->vObjFunc).pArray[(long)piVar8];
            if (((long)iVar11 < 1) || ((p->pDesign->vNtks).nSize <= iVar11)) goto LAB_003ded59;
            pvVar10 = (p->pDesign->vNtks).pArray[iVar11];
          }
          else {
LAB_003ded59:
            pvVar10 = (void *)0x0;
          }
          uVar14 = iVar13 + 2;
          if ((p->vObjFin0).nSize <= (int)uVar14) goto LAB_003df154;
          piVar4 = (p->vObjFin0).pArray;
          if (*(int *)((long)pvVar10 + 0x1c) != piVar4[uVar14] - piVar4[(long)piVar8]) {
            __assert_fail("Cba_NtkPiNum(pBox) == Cba_ObjFinNum(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadBlif.c"
                          ,0x233,"int Prs_CreateBlifNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          if ((p->vObjFon0).nSize <= (int)uVar14) goto LAB_003df154;
          piVar4 = (p->vObjFon0).pArray;
          if (*(int *)((long)pvVar10 + 0x2c) != piVar4[uVar14] - piVar4[(long)piVar8]) {
            __assert_fail("Cba_NtkPoNum(pBox) == Cba_ObjFonNum(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadBlif.c"
                          ,0x234,"int Prs_CreateBlifNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          pCVar3 = p->pDesign;
          in_RDX = piVar8;
          if (0 < (pCVar3->vUsed2).nSize) {
            piVar4 = (pCVar3->vUsed2).pArray;
            in_RDX = (int *)0x0;
            do {
              iVar11 = piVar4[(long)in_RDX];
              if (((long)iVar11 < 0) || ((pCVar3->vNameMap2).nSize <= iVar11)) goto LAB_003df173;
              (pCVar3->vNameMap2).pArray[iVar11] = 0;
              in_RDX = (int *)((long)in_RDX + 1);
            } while ((long)in_RDX < (long)(pCVar3->vUsed2).nSize);
          }
          (pCVar3->vUsed2).nSize = 0;
          if (0 < *(int *)((long)pvVar10 + 0x1c)) {
            lVar15 = 0;
            do {
              iVar11 = *(int *)(*(long *)((long)pvVar10 + 0x20) + lVar15 * 4);
              if ((long)iVar11 < 1) goto LAB_003df19b;
              if (*(int *)((long)pvVar10 + 0xcc) < 1) goto LAB_003df192;
              Vec_IntFillExtra((Vec_Int_t *)((long)pvVar10 + 200),iVar11 + 1,(int)in_RDX);
              if (*(int *)((long)pvVar10 + 0xcc) <= iVar11) goto LAB_003df154;
              iVar11 = *(int *)(*(long *)((long)pvVar10 + 0xd0) + (long)iVar11 * 4);
              lVar12 = (long)iVar11;
              pCVar3 = p->pDesign;
              Vec_IntFillExtra(&pCVar3->vNameMap2,iVar11 + 1,Fill_09);
              if ((lVar12 < 0) || ((pCVar3->vNameMap2).nSize <= iVar11)) goto LAB_003df154;
              if ((pCVar3->vNameMap2).pArray[lVar12] != 0) {
LAB_003df1ba:
                __assert_fail("Vec_IntGetEntry(&p->vNameMap2, i) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                              ,0x328,"void Cba_ManSetMap2(Cba_Man_t *, int, int)");
              }
              Vec_IntFillExtra(&pCVar3->vNameMap2,iVar11 + 1,Fill_10);
              if ((pCVar3->vNameMap2).nSize <= iVar11) goto LAB_003df173;
              lVar1 = lVar15 + 1;
              (pCVar3->vNameMap2).pArray[lVar12] = (int)lVar15 + 1;
              Vec_IntPush(&pCVar3->vUsed2,iVar11);
              in_RDX = extraout_RDX_06;
              lVar15 = lVar1;
            } while (lVar1 < *(int *)((long)pvVar10 + 0x1c));
          }
          if (1 < Prs_BoxSignals_V_1) {
            lVar15 = 1;
            do {
              iVar11 = Prs_BoxSignals_V_2[lVar15 + -1];
              lVar12 = (long)iVar11;
              iVar6 = Prs_BoxSignals_V_2[lVar15];
              pCVar3 = p->pDesign;
              Vec_IntFillExtra(&pCVar3->vNameMap2,iVar11 + 1,(int)in_RDX);
              if ((lVar12 < 0) || ((pCVar3->vNameMap2).nSize <= iVar11)) goto LAB_003df154;
              in_RDX = extraout_RDX_07;
              if (((pCVar3->vNameMap2).pArray[lVar12] != 0) &&
                 (iVar6 = Prs_CreateBlifFindFon(p,iVar6), in_RDX = extraout_RDX_08, iVar6 != 0)) {
                pCVar3 = p->pDesign;
                Vec_IntFillExtra(&pCVar3->vNameMap2,iVar11 + 1,(int)extraout_RDX_08);
                if (((pCVar3->vNameMap2).nSize <= iVar11) || ((p->vObjFin0).nSize <= (int)uVar5))
                goto LAB_003df154;
                uVar14 = ((pCVar3->vNameMap2).pArray[lVar12] + (p->vObjFin0).pArray[(long)piVar8]) -
                         1;
                if ((int)uVar14 < 1) goto LAB_003df217;
                if ((p->vFinFon).nSize <= (int)uVar14) goto LAB_003df154;
                piVar4 = (p->vFinFon).pArray;
                if (piVar4[uVar14] != 0) goto LAB_003df236;
                piVar4[uVar14] = iVar6;
                in_RDX = piVar8;
              }
              lVar15 = lVar15 + 2;
            } while ((int)lVar15 < Prs_BoxSignals_V_1);
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (pNtk->vObjs).nSize);
    }
  }
  if (0 < (p->vOutputs).nSize) {
    lVar9 = 0;
    do {
      iVar11 = (p->vOutputs).pArray[lVar9];
      lVar15 = (long)iVar11;
      if (lVar15 < 1) goto LAB_003df19b;
      if ((p->vObjName).nSize < 1) goto LAB_003df192;
      Vec_IntFillExtra(&p->vObjName,iVar11 + 1,(int)in_RDX);
      if ((p->vObjName).nSize <= iVar11) goto LAB_003df154;
      iVar6 = Prs_CreateBlifFindFon(p,(p->vObjName).pArray[lVar15]);
      in_RDX = extraout_RDX_10;
      if (iVar6 != 0) {
        if ((p->vObjFin0).nSize <= iVar11) {
LAB_003df154:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar11 = (p->vObjFin0).pArray[lVar15];
        lVar15 = (long)iVar11;
        if (lVar15 < 1) {
LAB_003df217:
          __assert_fail("f>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
        }
        if ((p->vFinFon).nSize <= iVar11) goto LAB_003df154;
        in_RDX = (p->vFinFon).pArray;
        if (in_RDX[lVar15] != 0) {
LAB_003df236:
          __assert_fail("Cba_ObjFinFon(p, i, k)== 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0x101,"void Cba_ObjSetFinFon(Cba_Ntk_t *, int, int, int)");
        }
        in_RDX[lVar15] = iVar6;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->vOutputs).nSize);
  }
  return 0;
LAB_003df19b:
  pcVar7 = "i>0";
  goto LAB_003df1a2;
LAB_003df192:
  pcVar7 = "Cba_NtkHasObjNames(p)";
LAB_003df1a2:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                ,0xf0,"int Cba_ObjName(Cba_Ntk_t *, int)");
}

Assistant:

int Prs_CreateBlifNtk( Cba_Ntk_t * p, Prs_Ntk_t * pNtk )
{
    Vec_Int_t * vBox;
    int i, k, iObj, iTerm, iFon, FormId, ActId;
    // map inputs
    Cba_NtkCleanMap( p );
    Cba_NtkForEachPi( p, iObj, i )
        Cba_NtkSetMap( p, Cba_ObjName(p, iObj), Cba_ObjFon0(p, iObj) );
    // create objects
    Prs_NtkForEachBox( pNtk, vBox, i )
    {
        int FuncId = Prs_BoxNtk(pNtk, i);
        assert( Prs_BoxIONum(pNtk, i) > 0 );
        assert( Vec_IntSize(vBox) % 2 == 0 );
        if ( FuncId == -1 ) // latch
        {
            iObj = Cba_ObjAlloc( p, CBA_BOX_DFFRS, 4, 1 );
            Cba_NtkSetMap( p, Vec_IntEntry(vBox, 3), Cba_ObjFon0(p, iObj) ); // latch output
            Cba_ObjSetFunc( p, iObj, Prs_BoxName(pNtk, i)+1 ); // init + 1
        }
        else if ( Prs_BoxIsNode(pNtk, i) ) // node
        {
            iObj = Cba_ObjAlloc( p, CBA_BOX_NODE, Prs_BoxIONum(pNtk, i)-1, 1 );
            Cba_FonSetName( p, Cba_ObjFon0(p, iObj), Vec_IntEntryLast(vBox) ); // node output
            Cba_NtkSetMap( p, Vec_IntEntryLast(vBox), Cba_ObjFon0(p, iObj) );
            Cba_ObjSetFunc( p, iObj, FuncId );
        }
        else // box
        {
            Cba_Ntk_t * pBox = Cba_ManNtkFind( p->pDesign, Prs_NtkStr(pNtk, FuncId) );
            iObj = Cba_ObjAlloc( p, CBA_OBJ_BOX, Cba_NtkPiNum(pBox), Cba_NtkPoNum(pBox) );
            Cba_ObjSetFunc( p, iObj, Cba_NtkId(pBox) );
            // mark PO objects
            Cba_NtkCleanMap2( p );
            Cba_NtkForEachPo( pBox, iTerm, k )
                Cba_NtkSetMap2( p, Cba_ObjName(pBox, iTerm), k+1 );
            // map box fons
            Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
                if ( Cba_NtkGetMap2(p, FormId) )
                {
                    iFon = Cba_ObjFon(p, iObj, Cba_NtkGetMap2(p, FormId)-1);
                    Cba_FonSetName( p, iFon, ActId );
                    Cba_NtkSetMap( p, ActId, iFon );
                }
        }
    }
    // connect objects
    Prs_NtkForEachBox( pNtk, vBox, i )
    {
        iObj = Cba_NtkPiNum(p) + Cba_NtkPoNum(p) + i + 1;
        if ( Prs_BoxNtk(pNtk, i) == -1 ) // latch
        {
            assert( Cba_ObjType(p, iObj) == CBA_BOX_DFFRS );
            iFon = Prs_CreateBlifFindFon( p, Vec_IntEntry(vBox, 1) ); // latch input
            if ( iFon )
                Cba_ObjSetFinFon( p, iObj, 0, iFon );
        }
        else if ( Prs_BoxIsNode(pNtk, i) ) // node
        {
            assert( Cba_ObjType(p, iObj) == CBA_BOX_NODE );
            Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
            {
                if ( k == 2 * Cba_ObjFinNum(p, iObj) ) // stop at node output
                    break;
                iFon = Prs_CreateBlifFindFon( p, ActId );
                if ( iFon )
                    Cba_ObjSetFinFon( p, iObj, k/2, iFon ); 
            }
        }
        else // box
        {
            // mark PI objects
            Cba_Ntk_t * pBox = Cba_ObjNtk(p, iObj);
            assert( Cba_NtkPiNum(pBox) == Cba_ObjFinNum(p, iObj) );
            assert( Cba_NtkPoNum(pBox) == Cba_ObjFonNum(p, iObj) );
            Cba_NtkCleanMap2( p );
            Cba_NtkForEachPi( pBox, iTerm, k )
                Cba_NtkSetMap2( p, Cba_ObjName(pBox, iTerm), k+1 );
            // connect box fins
            Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
                if ( Cba_NtkGetMap2(p, FormId) )
                {
                    iFon = Prs_CreateBlifFindFon( p, ActId );
                    if ( iFon )
                        Cba_ObjSetFinFon( p, iObj, Cba_NtkGetMap2(p, FormId)-1, iFon );
                }
        }
    }
    // connect outputs
    Cba_NtkForEachPo( p, iObj, i )
    {
        iFon = Prs_CreateBlifFindFon( p, Cba_ObjName(p, iObj) );
        if ( iFon )
            Cba_ObjSetFinFon( p, iObj, 0, iFon );
    }
    return 0;
}